

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zesVFManagementSetVFTelemetrySamplingIntervalExp
          (zes_vf_handle_t hVFhandle,zes_vf_info_util_exp_flags_t flag,uint64_t samplingInterval)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer pHVar5;
  size_type sStack_90;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  zes_pfnVFManagementSetVFTelemetrySamplingIntervalExp_t pfnSetVFTelemetrySamplingIntervalExp;
  allocator local_49;
  string local_48 [32];
  uint64_t local_28;
  uint64_t samplingInterval_local;
  zes_vf_handle_t p_Stack_18;
  zes_vf_info_util_exp_flags_t flag_local;
  zes_vf_handle_t hVFhandle_local;
  
  local_28 = samplingInterval;
  samplingInterval_local._4_4_ = flag;
  p_Stack_18 = hVFhandle;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,
             "zesVFManagementSetVFTelemetrySamplingIntervalExp(hVFhandle, flag, samplingInterval)",
             &local_49);
  loader::Logger::log_trace(this,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = *(code **)(context + 0xd08);
  if (pcVar1 == (code *)0x0) {
    hVFhandle_local._4_4_ =
         logAndPropagateResult
                   ("zesVFManagementSetVFTelemetrySamplingIntervalExp",
                    ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      zVar2 = (*(*ppvVar4)->zesValidation->_vptr_ZESValidationEntryPoints[0x11e])
                        ((*ppvVar4)->zesValidation,p_Stack_18,(ulong)samplingInterval_local._4_4_,
                         local_28);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zesVFManagementSetVFTelemetrySamplingIntervalExp",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      zVar2 = ZESHandleLifetimeValidation::zesVFManagementSetVFTelemetrySamplingIntervalExpPrologue
                        (&pHVar5->zesHandleLifetime,p_Stack_18,samplingInterval_local._4_4_,local_28
                        );
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zesVFManagementSetVFTelemetrySamplingIntervalExp",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(p_Stack_18,samplingInterval_local._4_4_,local_28);
    for (sStack_90 = 0; sStack_90 < sVar3; sStack_90 = sStack_90 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_90);
      result_00 = (*(*ppvVar4)->zesValidation->_vptr_ZESValidationEntryPoints[0x11f])
                            ((*ppvVar4)->zesValidation,p_Stack_18,
                             (ulong)samplingInterval_local._4_4_,local_28,(ulong)zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zesVFManagementSetVFTelemetrySamplingIntervalExp",result_00);
        return zVar2;
      }
    }
    hVFhandle_local._4_4_ =
         logAndPropagateResult("zesVFManagementSetVFTelemetrySamplingIntervalExp",zVar2);
  }
  return hVFhandle_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementSetVFTelemetrySamplingIntervalExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the component.
        zes_vf_info_util_exp_flags_t flag,              ///< [in] utilization flags to set sampling interval. May be 0 or a valid
                                                        ///< combination of ::zes_vf_info_util_exp_flag_t.
        uint64_t samplingInterval                       ///< [in] Sampling interval value.
        )
    {
        context.logger->log_trace("zesVFManagementSetVFTelemetrySamplingIntervalExp(hVFhandle, flag, samplingInterval)");

        auto pfnSetVFTelemetrySamplingIntervalExp = context.zesDdiTable.VFManagementExp.pfnSetVFTelemetrySamplingIntervalExp;

        if( nullptr == pfnSetVFTelemetrySamplingIntervalExp )
            return logAndPropagateResult("zesVFManagementSetVFTelemetrySamplingIntervalExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementSetVFTelemetrySamplingIntervalExpPrologue( hVFhandle, flag, samplingInterval );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementSetVFTelemetrySamplingIntervalExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesVFManagementSetVFTelemetrySamplingIntervalExpPrologue( hVFhandle, flag, samplingInterval );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementSetVFTelemetrySamplingIntervalExp", result);
        }

        auto driver_result = pfnSetVFTelemetrySamplingIntervalExp( hVFhandle, flag, samplingInterval );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementSetVFTelemetrySamplingIntervalExpEpilogue( hVFhandle, flag, samplingInterval ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementSetVFTelemetrySamplingIntervalExp", result);
        }

        return logAndPropagateResult("zesVFManagementSetVFTelemetrySamplingIntervalExp", driver_result);
    }